

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O3

REF_STATUS ref_swap_ratio(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  REF_DBL *pRVar1;
  REF_NODE ref_node;
  uint uVar2;
  undefined8 uVar3;
  char *pcVar4;
  REF_INT node3;
  REF_INT node2;
  REF_DBL ratio;
  REF_INT local_30;
  REF_INT local_2c;
  double local_28;
  
  ref_node = ref_grid->node;
  *allowed = 0;
  uVar2 = ref_swap_node23(ref_grid,node0,node1,&local_2c,&local_30);
  if (uVar2 == 0) {
    uVar2 = ref_node_ratio(ref_node,local_2c,local_30,&local_28);
    if (uVar2 == 0) {
      pRVar1 = &ref_grid->adapt->post_min_ratio;
      if (local_28 < *pRVar1 || local_28 == *pRVar1) {
        return 0;
      }
      if (ref_grid->adapt->post_max_ratio <= local_28) {
        return 0;
      }
      *allowed = 1;
      return 0;
    }
    pcVar4 = "ratio";
    uVar3 = 0x276;
  }
  else {
    pcVar4 = "other nodes";
    uVar3 = 0x275;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",uVar3,
         "ref_swap_ratio",(ulong)uVar2,pcVar4);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_swap_ratio(REF_GRID ref_grid, REF_INT node0,
                                  REF_INT node1, REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node2, node3;
  REF_DBL ratio;

  *allowed = REF_FALSE;

  RSS(ref_swap_node23(ref_grid, node0, node1, &node2, &node3), "other nodes");
  RSS(ref_node_ratio(ref_node, node2, node3, &ratio), "ratio");

  if (ref_grid_adapt(ref_grid, post_min_ratio) < ratio &&
      ratio < ref_grid_adapt(ref_grid, post_max_ratio)) {
    *allowed = REF_TRUE;
    return REF_SUCCESS;
  }

  return REF_SUCCESS;
}